

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

int qp_lookahead_eol(mime_encoder_state *st,int ateof,size_t n)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = n + st->bufbeg;
  iVar1 = 1;
  if (ateof == 0 || uVar2 < st->bufend) {
    if (st->bufend < uVar2 + 2) {
      return -(uint)(ateof == 0);
    }
    if ((""[(byte)st->buf[uVar2]] != '\x03') || (""[(byte)st->buf[uVar2 + 1]] != '\x04')) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int qp_lookahead_eol(struct mime_encoder_state *st, int ateof, size_t n)
{
  n += st->bufbeg;
  if(n >= st->bufend && ateof)
    return 1;
  if(n + 2 > st->bufend)
    return ateof ? 0 : -1;
  if(qp_class[st->buf[n] & 0xFF] == QP_CR &&
     qp_class[st->buf[n + 1] & 0xFF] == QP_LF)
    return 1;
  return 0;
}